

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O0

char * lib_dlb_fgets(char *buf,int len,dlb *dp)

{
  int iVar1;
  bool bVar2;
  char local_39;
  char *pcStack_38;
  char c;
  char *bp;
  int i;
  dlb *dp_local;
  int len_local;
  char *buf_local;
  
  local_39 = '\0';
  buf_local = buf;
  if (0 < len) {
    if (dp->mark < dp->size) {
      bp._4_4_ = 0;
      pcStack_38 = buf;
      while( true ) {
        bVar2 = false;
        if ((bp._4_4_ < len + -1) && (bVar2 = false, dp->mark < dp->size)) {
          bVar2 = local_39 != '\n';
        }
        if ((!bVar2) || (iVar1 = dlb_fread(pcStack_38,1,1,dp), iVar1 < 1)) break;
        local_39 = *pcStack_38;
        bp._4_4_ = bp._4_4_ + 1;
        pcStack_38 = pcStack_38 + 1;
      }
      *pcStack_38 = '\0';
    }
    else {
      buf_local = (char *)0x0;
    }
  }
  return buf_local;
}

Assistant:

static char *lib_dlb_fgets(char *buf, int len, dlb *dp)
{
    int i;
    char *bp, c = 0;

    if (len <= 0) return buf;	/* sanity check */

    /* return NULL on EOF */
    if (dp->mark >= dp->size) return NULL;

    len--;	/* save room for null */
    for (i = 0, bp = buf;
		i < len && dp->mark < dp->size && c != '\n'; i++, bp++) {
	if (dlb_fread(bp, 1, 1, dp) <= 0) break;	/* EOF or error */
	c = *bp;
    }
    *bp = '\0';

#if defined(WIN32)
    if ((bp = strchr(buf, '\r')) != 0) {
	*bp++ = '\n';
	*bp = '\0';
    }
#endif

    return buf;
}